

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void transaction_tests::ReplaceRedeemScript(CScript *script,CScript *redeemScript)

{
  size_type sVar1;
  const_iterator this;
  const_iterator __a;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  allocator<unsigned_char> *in_stack_ffffffffffffff18;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff20;
  CScript *pCVar2;
  ScriptError *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  SigVersion sigversion;
  BaseSignatureChecker *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  uint flags;
  const_iterator __last;
  const_iterator __first;
  CScript local_60;
  undefined1 local_40 [56];
  long local_8;
  
  flags = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  sigversion = (SigVersion)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (CScript *)local_40;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_ffffffffffffff18);
  local_60.super_CScriptBase._24_8_ = 0;
  __last.ptr = (uchar *)((long)&local_60.super_CScriptBase._union + 0x18);
  BaseSignatureChecker::BaseSignatureChecker((BaseSignatureChecker *)in_stack_ffffffffffffff18);
  EvalScript(in_RDI,pCVar2,flags,in_stack_ffffffffffffff40,sigversion,in_stack_ffffffffffffff30);
  BaseSignatureChecker::~BaseSignatureChecker((BaseSignatureChecker *)in_stack_ffffffffffffff18);
  sVar1 = std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffff18);
  if (sVar1 == 0) {
    __assert_fail("stack.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x207,"void transaction_tests::ReplaceRedeemScript(CScript &, const CScript &)");
  }
  this = prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_ffffffffffffff20);
  __a = prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff20);
  __first = __a;
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff18);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this.ptr,__first,__last,
             (allocator_type *)__a.ptr);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)in_stack_ffffffffffffff18);
  pCVar2 = &local_60;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pCVar2,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pCVar2);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff18);
  PushAll((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)__last.ptr);
  CScript::operator=(pCVar2,(CScript *)(local_40 + 0x18));
  CScript::~CScript((CScript *)in_stack_ffffffffffffff18);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)pCVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ReplaceRedeemScript(CScript& script, const CScript& redeemScript)
{
    std::vector<valtype> stack;
    EvalScript(stack, script, SCRIPT_VERIFY_STRICTENC, BaseSignatureChecker(), SigVersion::BASE);
    assert(stack.size() > 0);
    stack.back() = std::vector<unsigned char>(redeemScript.begin(), redeemScript.end());
    script = PushAll(stack);
}